

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>_>::
int_writer<long_long,_duckdb_fmt::v6::basic_format_specs<wchar_t>_>::on_hex
          (int_writer<long_long,_duckdb_fmt::v6::basic_format_specs<wchar_t>_> *this)

{
  char cVar1;
  uint uVar2;
  hex_writer f;
  int iVar3;
  char *in_RDI;
  string_view sVar4;
  size_t unaff_retaddr;
  format_specs in_stack_00000010;
  int num_digits;
  undefined1 local_48 [36];
  int in_stack_ffffffffffffffdc;
  basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>_> *this_00;
  size_t sVar5;
  undefined4 in_stack_fffffffffffffff0;
  char *pcVar6;
  
  if (*(char *)(*(long *)(in_RDI + 8) + 9) < '\0') {
    uVar2 = *(uint *)(in_RDI + 0x1c);
    *(uint *)(in_RDI + 0x1c) = uVar2 + 1;
    in_RDI[(ulong)uVar2 + 0x18] = '0';
    cVar1 = *(char *)(*(long *)(in_RDI + 8) + 8);
    uVar2 = *(uint *)(in_RDI + 0x1c);
    *(uint *)(in_RDI + 0x1c) = uVar2 + 1;
    in_RDI[(ulong)uVar2 + 0x18] = cVar1;
  }
  pcVar6 = in_RDI;
  iVar3 = count_digits<4u,unsigned_long>(*(unsigned_long *)(in_RDI + 0x10));
  sVar4 = get_prefix((int_writer<long_long,_duckdb_fmt::v6::basic_format_specs<wchar_t>_> *)
                     0x25ba2ab);
  this_00 = (basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>_> *)sVar4.data_;
  sVar5 = sVar4.size_;
  memcpy(local_48,*(void **)(in_RDI + 8),0x28);
  sVar4.size_ = unaff_retaddr;
  sVar4.data_ = pcVar6;
  f.num_digits = in_stack_fffffffffffffff0;
  f.self = (int_writer<long_long,_duckdb_fmt::v6::basic_format_specs<wchar_t>_> *)sVar5;
  f._12_4_ = iVar3;
  basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>>::
  write_int<duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>>::int_writer<long_long,duckdb_fmt::v6::basic_format_specs<wchar_t>>::hex_writer>
            (this_00,in_stack_ffffffffffffffdc,sVar4,in_stack_00000010,f);
  return;
}

Assistant:

void on_hex() {
      if (specs.alt) {
        prefix[prefix_size++] = '0';
        prefix[prefix_size++] = specs.type;
      }
      int num_digits = count_digits<4>(abs_value);
      writer.write_int(num_digits, get_prefix(), specs,
                       hex_writer{*this, num_digits});
    }